

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O2

bool IsBDOSDisk(HDD *hdd,BDOS_CAPS *bdc)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  int i;
  long lVar4;
  MEMORY mem;
  BDOS_CAPS bdcLBA;
  MEMORY local_50;
  BDOS_CAPS local_38;
  
  if (hdd->sector_size != 0x200) {
    return false;
  }
  local_50._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
  local_50.size = 0x200;
  local_50.pb = AllocMem(0x200);
  GetBDOSCaps((long)hdd->sectors * (long)hdd->heads * (long)hdd->cyls,bdc);
  bVar3 = ReadSector(hdd,bdc->base_sectors,&local_50);
  if (bVar3) {
    iVar2 = *(int *)((long)local_50.pb + 0xe8);
    bdc->need_byteswap = iVar2 == 0x4f534244;
    bVar3 = true;
    if ((iVar2 == 0x4f534244) || (*(int *)((long)local_50.pb + 0xe8) == 0x534f4442))
    goto LAB_0016e9bb;
  }
  local_38.list_sectors = 0;
  local_38.base_sectors = 0;
  local_38._8_7_ = 0;
  local_38.extra_sectors._3_1_ = 0;
  local_38.need_byteswap = false;
  local_38.bootable = false;
  local_38.lba = false;
  GetBDOSCaps(hdd->total_sectors,&local_38);
  if (((local_38.base_sectors == bdc->base_sectors) ||
      (bVar3 = ReadSector(hdd,local_38.base_sectors,&local_50), !bVar3)) ||
     ((local_38.need_byteswap = *(int *)((long)local_50.pb + 0xe8) == 0x4f534244,
      local_38.lba = local_38.need_byteswap, !local_38.need_byteswap &&
      (local_38.lba = *(int *)((long)local_50.pb + 0xe8) == 0x534f4442, !local_38.lba)))) {
    bVar3 = ReadSector(hdd,0,&local_50);
    if (bVar3) {
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        *(byte *)((long)local_50.pb + lVar4) = *(byte *)((long)local_50.pb + lVar4) & 0x5f;
        pbVar1 = (byte *)((long)local_50.pb + lVar4 + 0x100);
        *pbVar1 = *pbVar1 & 0x5f;
      }
      iVar2 = *(int *)local_50.pb;
      bdc->need_byteswap = iVar2 == 0x4f54424f;
      if (iVar2 == 0x4f54424f) {
        bVar3 = true;
      }
      else {
        bVar3 = *(int *)((long)local_50.pb + 0x100) == 0x544f4f42;
      }
      bdc->bootable = bVar3;
    }
    else {
      bVar3 = false;
    }
  }
  else {
    *(uint *)((long)&bdc->extra_sectors + 3) =
         CONCAT13(local_38.lba,
                  CONCAT12(local_38.bootable,
                           CONCAT11(local_38.need_byteswap,local_38.extra_sectors._3_1_)));
    bdc->list_sectors = local_38.list_sectors;
    bdc->base_sectors = local_38.base_sectors;
    bdc->records = local_38.records;
    bdc->extra_sectors = (int)(CONCAT17(local_38.extra_sectors._3_1_,local_38._8_7_) >> 0x20);
    bVar3 = true;
  }
LAB_0016e9bb:
  MEMORY::~MEMORY(&local_50);
  return bVar3;
}

Assistant:

bool IsBDOSDisk(const HDD& hdd, BDOS_CAPS& bdc)
{
    bool f = false;

    // Sector size must be 512 bytes for BDOS
    if (hdd.sector_size != BDOS_SECTOR_SIZE)
        return false;

    MEMORY mem(hdd.sector_size);

    // Determine BDOS parameters from the CHS geometry (as BDOS does)
    GetBDOSCaps(hdd.cyls * hdd.heads * hdd.sectors, bdc);

    // Read the first sector in record 1 to check for a BDOS signature
    if (ReadSector(hdd, bdc.base_sectors, mem))
    {
        f = bdc.need_byteswap = !memcmp(mem + 232, "DBSO", 4);
        if (!f) f = !memcmp(mem + 232, "BDOS", 4);
    }

    // If that didn't work, try record 1 using LBA sector count
    if (!f)
    {
        // Determine the BDOS parameters from the LBA sector count (as Trinity does, and SAMdisk used to)
        BDOS_CAPS bdcLBA;
        GetBDOSCaps(hdd.total_sectors, bdcLBA);

        // Only check the base sector if it differs from the CHS position
        if (bdcLBA.base_sectors != bdc.base_sectors && ReadSector(hdd, bdcLBA.base_sectors, mem))
        {
            f = bdcLBA.need_byteswap = !memcmp(mem + 232, "DBSO", 4);
            if (!f) f = !memcmp(mem + 232, "BDOS", 4);
            bdcLBA.lba = f;

            // If the disk is relying on the LBA sector count, use the new details
            if (f)
                bdc = bdcLBA;
        }
    }

    // If we're still not sure, check for a BDOS boot sector
    if (!f && ReadSector(hdd, 0, mem))
    {
        // Clear bits 7 and 5 (case) for the boot signature check
        for (int i = 0; i < 4; ++i) { mem[i + 0x000] &= ~0xa0; mem[i + 0x100] &= ~0xa0; }

        // Check for the boot sector signatures at the appropriate offsets for Atom and Atom Lite
        bdc.need_byteswap = !memcmp(mem + 0x000, "OBTO", 4);
        bdc.bootable = bdc.need_byteswap || !memcmp(mem + 0x100, "BOOT", 4);
        f = bdc.bootable;
    }

    return f;
}